

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamToolsIndex::LoadFileSummary(BamToolsIndex *this)

{
  pointer pBVar1;
  pointer refSummary;
  int numReferences;
  int local_1c;
  
  LoadNumReferences(this,&local_1c);
  InitializeFileSummary(this,&local_1c);
  pBVar1 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (refSummary = (this->m_indexFileSummary).
                    super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                    ._M_impl.super__Vector_impl_data._M_start; refSummary != pBVar1;
      refSummary = refSummary + 1) {
    LoadReferenceSummary(this,refSummary);
  }
  return;
}

Assistant:

void BamToolsIndex::LoadFileSummary()
{

    // load number of reference sequences
    int numReferences;
    LoadNumReferences(numReferences);

    // initialize file summary data
    InitializeFileSummary(numReferences);

    // load summary for each reference
    BtiFileSummary::iterator summaryIter = m_indexFileSummary.begin();
    BtiFileSummary::iterator summaryEnd = m_indexFileSummary.end();
    for (; summaryIter != summaryEnd; ++summaryIter) {
        LoadReferenceSummary(*summaryIter);
    }
}